

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_h_predictor_8x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined1 (*pauVar1) [16];
  uint16_t *puVar2;
  undefined4 uVar4;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar3 = *(undefined1 (*) [16])left;
  auVar5 = pshuflw(in_XMM1,auVar3,0);
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  *(undefined1 (*) [16])dst = auVar5;
  auVar5 = pshuflw(auVar5,auVar3,0x55);
  auVar6._0_4_ = auVar5._0_4_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = auVar6._0_4_;
  auVar6._12_4_ = auVar6._0_4_;
  *(undefined1 (*) [16])(dst + stride) = auVar6;
  pauVar1 = (undefined1 (*) [16])((long)*(undefined1 (*) [16])(dst + stride) + stride * 2);
  auVar5 = pshuflw(auVar6,auVar3,0xaa);
  auVar7._0_4_ = auVar5._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  *pauVar1 = auVar7;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshuflw(auVar7,auVar3,0xff);
  auVar8._0_4_ = auVar5._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  *pauVar1 = auVar8;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar8,auVar3,0);
  auVar9._8_4_ = auVar5._8_4_;
  auVar9._4_4_ = auVar9._8_4_;
  auVar9._0_4_ = auVar9._8_4_;
  auVar9._12_4_ = auVar9._8_4_;
  *pauVar1 = auVar9;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar9,auVar3,0x55);
  auVar10._8_4_ = auVar5._8_4_;
  auVar10._4_4_ = auVar10._8_4_;
  auVar10._0_4_ = auVar10._8_4_;
  auVar10._12_4_ = auVar10._8_4_;
  *pauVar1 = auVar10;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar10,auVar3,0xaa);
  auVar11._8_4_ = auVar5._8_4_;
  auVar11._4_4_ = auVar11._8_4_;
  auVar11._0_4_ = auVar11._8_4_;
  auVar11._12_4_ = auVar11._8_4_;
  *pauVar1 = auVar11;
  auVar3 = pshufhw(auVar3,auVar3,0xff);
  uVar4 = auVar3._8_4_;
  puVar2 = (uint16_t *)((long)*pauVar1 + stride * 2);
  *(undefined4 *)puVar2 = uVar4;
  *(undefined4 *)(puVar2 + 2) = uVar4;
  *(undefined4 *)(puVar2 + 4) = uVar4;
  *(undefined4 *)(puVar2 + 6) = uVar4;
  auVar3 = *(undefined1 (*) [16])(left + 8);
  auVar5 = pshuflw(auVar11,auVar3,0);
  auVar12._0_4_ = auVar5._0_4_;
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  *(undefined1 (*) [16])(dst + stride * 8) = auVar12;
  auVar5 = pshuflw(auVar12,auVar3,0x55);
  auVar13._0_4_ = auVar5._0_4_;
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  *(undefined1 (*) [16])(dst + stride * 9) = auVar13;
  pauVar1 = (undefined1 (*) [16])((long)*(undefined1 (*) [16])(dst + stride * 9) + stride * 2);
  auVar5 = pshuflw(auVar13,auVar3,0xaa);
  auVar14._0_4_ = auVar5._0_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  *pauVar1 = auVar14;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshuflw(auVar14,auVar3,0xff);
  auVar15._0_4_ = auVar5._0_4_;
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar15._0_4_;
  auVar15._12_4_ = auVar15._0_4_;
  *pauVar1 = auVar15;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar15,auVar3,0);
  auVar16._8_4_ = auVar5._8_4_;
  auVar16._4_4_ = auVar16._8_4_;
  auVar16._0_4_ = auVar16._8_4_;
  auVar16._12_4_ = auVar16._8_4_;
  *pauVar1 = auVar16;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar16,auVar3,0x55);
  auVar17._8_4_ = auVar5._8_4_;
  auVar17._4_4_ = auVar17._8_4_;
  auVar17._0_4_ = auVar17._8_4_;
  auVar17._12_4_ = auVar17._8_4_;
  *pauVar1 = auVar17;
  puVar2 = (uint16_t *)((long)*pauVar1 + stride * 2);
  auVar5 = pshufhw(auVar17,auVar3,0xaa);
  uVar4 = auVar5._8_4_;
  *(undefined4 *)puVar2 = uVar4;
  *(undefined4 *)(puVar2 + 2) = uVar4;
  *(undefined4 *)(puVar2 + 4) = uVar4;
  *(undefined4 *)(puVar2 + 6) = uVar4;
  auVar3 = pshufhw(auVar3,auVar3,0xff);
  uVar4 = auVar3._8_4_;
  puVar2 = puVar2 + stride;
  *(undefined4 *)puVar2 = uVar4;
  *(undefined4 *)(puVar2 + 2) = uVar4;
  *(undefined4 *)(puVar2 + 4) = uVar4;
  *(undefined4 *)(puVar2 + 6) = uVar4;
  return;
}

Assistant:

void aom_highbd_h_predictor_8x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  const __m128i row4 = _mm_shufflehi_epi16(left_u16, 0x0);
  const __m128i row5 = _mm_shufflehi_epi16(left_u16, 0x55);
  const __m128i row6 = _mm_shufflehi_epi16(left_u16, 0xaa);
  const __m128i row7 = _mm_shufflehi_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row0, row0));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row1, row1));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row2, row2));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row3, row3));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row4, row4));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row5, row5));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row6, row6));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row7, row7));
}